

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPUDPv6Transmitter::DeleteTransmissionInfo
          (RTPUDPv6Transmitter *this,RTPTransmissionInfo *i)

{
  RTPMemoryManager *mgr;
  RTPTransmissionInfo *i_local;
  RTPUDPv6Transmitter *this_local;
  
  if ((this->init & 1U) != 0) {
    mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    RTPDelete<jrtplib::RTPTransmissionInfo>(i,mgr);
  }
  return;
}

Assistant:

void RTPUDPv6Transmitter::DeleteTransmissionInfo(RTPTransmissionInfo *i)
{
	if (!init)
		return;

	RTPDelete(i, GetMemoryManager());
}